

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::addLineBreaks
                   (string *__return_storage_ptr__,string *str,size_t columns,size_t indent)

{
  size_type sVar1;
  string local_220;
  string local_200;
  string local_1d0 [8];
  string paragraph;
  size_type newline;
  size_type pos;
  ostringstream oss;
  size_t indent_local;
  size_t columns_local;
  string *str_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pos);
  newline = 0;
  paragraph.field_2._8_8_ = std::__cxx11::string::find_first_of((char)str,10);
  while (paragraph.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_1d0,(ulong)str);
    std::__cxx11::string::string((string *)&local_200,local_1d0);
    recursivelyWrapLine((ostream *)&pos,&local_200,columns,indent);
    std::__cxx11::string::~string((string *)&local_200);
    newline = paragraph.field_2._8_8_ + 1;
    paragraph.field_2._8_8_ = std::__cxx11::string::find_first_of((char)str,10);
    std::__cxx11::string::~string(local_1d0);
  }
  sVar1 = std::__cxx11::string::size();
  if (newline != sVar1) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_220,(ulong)str);
    recursivelyWrapLine((ostream *)&pos,&local_220,columns,indent);
    std::__cxx11::string::~string((string *)&local_220);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pos);
  return __return_storage_ptr__;
}

Assistant:

inline std::string addLineBreaks( const std::string& str, std::size_t columns, std::size_t indent = 0 ) {
        std::ostringstream oss;
        std::string::size_type pos = 0;
        std::string::size_type newline = str.find_first_of( '\n' );
        while( newline != std::string::npos ) {
            std::string paragraph = str.substr( pos, newline-pos );
            recursivelyWrapLine( oss, paragraph, columns, indent );
            pos = newline+1;
            newline = str.find_first_of( '\n', pos );
        }
        if( pos != str.size() )
            recursivelyWrapLine( oss, str.substr( pos, str.size()-pos ), columns, indent );

        return oss.str();
    }